

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O1

char * Fverb::parameter_unit(uint index)

{
  if (index < 0xb) {
    return &DAT_0010baa0 + *(int *)(&DAT_0010baa0 + (ulong)index * 4);
  }
  return (char *)0x0;
}

Assistant:

const char *Fverb::parameter_unit(unsigned index) noexcept
{
    switch (index) {

    case 0:
        return "ms";

    case 1:
        return "%";

    case 2:
        return "Hz";

    case 3:
        return "Hz";

    case 4:
        return "%";

    case 5:
        return "%";

    case 6:
        return "%";

    case 7:
        return "%";

    case 8:
        return "Hz";

    case 9:
        return "Hz";

    case 10:
        return "ms";

    default:
        return 0;
    }
}